

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

bool __thiscall
wasm::PrintExpressionContents::printUnreachableOrNullReplacement
          (PrintExpressionContents *this,Expression *curr)

{
  ostream *stream;
  bool bVar1;
  HeapType local_20;
  
  if ((curr->type).id == 1) {
LAB_00849375:
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(stream,"block",5);
    Colors::outputColorCode(stream,"\x1b[0m");
    bVar1 = true;
  }
  else {
    bVar1 = wasm::Type::isRef(&curr->type);
    if (bVar1) {
      local_20 = wasm::Type::getHeapType(&curr->type);
      bVar1 = HeapType::isBottom(&local_20);
      if (bVar1) goto LAB_00849375;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool printUnreachableOrNullReplacement(Expression* curr) {
    if (curr->type == Type::unreachable || curr->type.isNull()) {
      printMedium(o, "block");
      return true;
    }
    return false;
  }